

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry>::setCapacity
          (Vector<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *this,
          size_t newSize)

{
  Entry *pEVar1;
  RemoveConst<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *pRVar2;
  Entry *pEVar3;
  ulong uVar4;
  size_t __n;
  ArrayBuilder<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> local_48;
  
  pEVar1 = (this->builder).ptr;
  uVar4 = ((long)(this->builder).pos - (long)pEVar1 >> 4) * -0x3333333333333333;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    (this->builder).pos = pEVar1 + newSize;
  }
  pEVar3 = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                              (0x50,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
  ;
  local_48.endPtr = pEVar3 + newSize;
  local_48.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pEVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pEVar1;
  local_48.ptr = pEVar3;
  if (__n != 0) {
    memcpy(pEVar3,pEVar1,__n);
  }
  local_48.pos = (RemoveConst<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *)
                 ((long)pEVar3 + __n);
  ArrayBuilder<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry>::operator=
            (&this->builder,&local_48);
  pEVar3 = local_48.endPtr;
  pRVar2 = local_48.pos;
  pEVar1 = local_48.ptr;
  if (local_48.ptr != (Entry *)0x0) {
    local_48.ptr = (Entry *)0x0;
    local_48.pos = (RemoveConst<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *)0x0
    ;
    local_48.endPtr = (Entry *)0x0;
    (**(local_48.disposer)->_vptr_ArrayDisposer)
              (local_48.disposer,pEVar1,0x50,
               ((long)pRVar2 - (long)pEVar1 >> 4) * -0x3333333333333333,
               ((long)pEVar3 - (long)pEVar1 >> 4) * -0x3333333333333333,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }